

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O2

ogt_vox_keyframe_transform * __thiscall
_vox_suballoc_array::get_ptr<ogt_vox_keyframe_transform>(_vox_suballoc_array *this,size_t offset)

{
  if (offset % 0x44 != 0) {
    __assert_fail("(0 == offset % sizeof(T)) && (\"offset is not properly aligned for this datatype\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x354,"T *_vox_suballoc_array::get_ptr(size_t) [T = ogt_vox_keyframe_transform]")
    ;
  }
  if (offset < (this->data).count) {
    return (ogt_vox_keyframe_transform *)((this->data).data + offset);
  }
  __assert_fail("(index < count) && (\"index out of bounds\")",
                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                ,0x324,"T &_vox_array<char>::operator[](size_t) [T = char]");
}

Assistant:

T * get_ptr(size_t offset) {
            ogt_assert(0 == offset % sizeof(T), "offset is not properly aligned for this datatype");
            return (T*)&data[offset];
        }